

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

int xp_compute(CHAR_DATA *gch,CHAR_DATA *victim,int group_amount,int glevel)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA **ch;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_2c;
  float local_28;
  
  fVar3 = (float)(glevel / group_amount);
  fVar5 = (float)(int)gch->level;
  iVar2 = (int)victim->level - (int)gch->level;
  local_2c = 0.0;
  if (iVar2 + 9U < 0xe) {
    local_2c = *(float *)(&DAT_003d7a90 + (ulong)(iVar2 + 9U) * 4);
  }
  if (4 < iVar2) {
    local_2c = (float)(iVar2 * 0x14 + 200);
  }
  bVar1 = is_good(gch);
  fVar4 = local_2c;
  if (bVar1) {
    bVar1 = is_evil(victim);
    if (!bVar1) {
      bVar1 = is_good(victim);
      fVar4 = 0.0;
      if (!bVar1) {
        fVar4 = local_2c;
      }
      goto LAB_002efdbc;
    }
  }
  else {
    bVar1 = is_evil(gch);
    if (!bVar1) goto LAB_002efdbc;
    bVar1 = is_good(victim);
    if (!bVar1) {
      bVar1 = is_evil(victim);
      if (bVar1) {
        fVar4 = local_2c * 0.5;
      }
      goto LAB_002efdbc;
    }
  }
  fVar4 = (local_2c * 4.0) / 3.0;
LAB_002efdbc:
  iVar2 = number_range((int)(fVar4 * 3.0 * 0.25),(int)(fVar4 * 5.0 * 0.25));
  local_28 = (((float)(~-(uint)(fVar5 < fVar3) & (uint)(fVar5 - fVar3) |
                      (uint)(fVar3 - fVar5) & -(uint)(fVar5 < fVar3)) * -6.0 + 100.0) / 100.0) *
             (float)iVar2;
  bVar1 = is_npc(victim);
  if ((bVar1) && (victim->law_pass == true)) {
    local_28 = local_28 * 0.55;
  }
  bVar1 = is_npc(gch);
  if (bVar1) {
    fVar3 = 1.75;
  }
  else {
    ch = &char_list;
    fVar3 = 1.75;
    while (ch = &((CHAR_DATA *)ch)->next->next, (CHAR_DATA *)ch != (CHAR_DATA *)0x0) {
      bVar1 = is_npc((CHAR_DATA *)ch);
      if ((((CHAR_DATA *)ch != gch && !bVar1) &&
          ((int)((CHAR_DATA *)ch)->level < gch->level + 8 &&
           gch->level + -8 < (int)((CHAR_DATA *)ch)->level)) &&
         (fVar3 = fVar3 + -0.25, fVar3 <= 1.0)) {
        fVar3 = 1.0;
      }
    }
  }
  if ((group_amount == 2) && (fVar3 = fVar3 * 0.66, fVar3 <= 1.0)) {
    fVar3 = 1.0;
  }
  fVar5 = (local_28 * 12.0) / 10.0;
  if (3 < group_amount) {
    fVar5 = fVar5 / (float)(group_amount + -2);
  }
  if (group_amount == 3) {
    fVar3 = 1.0;
  }
  return (int)(fVar5 * fVar3);
}

Assistant:

int xp_compute(CHAR_DATA *gch, CHAR_DATA *victim, int group_amount, int glevel)
{
	float xp, base_exp;
	int level_range;
	float mult, peer_factor = BASE_PEER_FACTOR, gavg = glevel / group_amount;
	CHAR_DATA *cPeers = nullptr;
	mult = (100 - (gavg > gch->level ? gavg - gch->level : gch->level - gavg) * 6) / 100;
	level_range = victim->level - gch->level;

	/* compute the base exp */
	switch (level_range)
	{
		case -9:
			base_exp = 2;
			break;
		case -8:
			base_exp = 4;
			break;
		case -7:
			base_exp = 7;
			break;
		case -6:
			base_exp = 12;
			break;
		case -5:
			base_exp = 14;
			break;
		case -4:
			base_exp = 25;
			break;
		case -3:
			base_exp = 36;
			break;
		case -2:
			base_exp = 55;
			break;
		case -1:
			base_exp = 85;
			break;
		case 0:
			base_exp = 100;
			break;
		case 1:
			base_exp = 150;
			break;
		case 2:
			base_exp = 200;
			break;
		case 3:
			base_exp = 250;
			break;
		case 4:
			base_exp = 300;
			break;
		default:
			base_exp = 0;
			break;
	}

	if (level_range > 4)
		base_exp = 200 + 20 * level_range;

	if (is_good(gch))
	{
		if (is_evil(victim))
			xp = (base_exp * 4) / 3;
		else if (is_good(victim))
			xp = 0;
		else
			xp = base_exp;
	}
	else if (is_evil(gch))
	{
		if (is_good(victim))
			xp = (base_exp * 4) / 3;
		else if (is_evil(victim))
			xp = base_exp / 2;
		else
			xp = base_exp;
	}
	else /* neutral */
	{
		xp = base_exp;
	}

	xp = number_range((int)(xp * 3 / 4), (int)(xp * 5 / 4));
	xp *= mult;

	//    if(is_npc(victim))
	//	xp *= (float)victim->pIndexData->xp_mod / (float)100;
	if (is_npc(victim) && victim->law_pass)
		xp *= SUMMONED_XP_PENALTY;
	/* adjust for grouping */

	// if (group_amount == 2)
	//    xp = (xp * 4)/3;
	// if (group_amount == 3)
	//
	xp = (xp * 12) / 10;

	if (group_amount > 3)
		xp /= (group_amount - 2);

	if (!is_npc(gch))
	{
		for (cPeers = char_list; cPeers; cPeers = cPeers->next)
		{
			if (!is_npc(cPeers)
				&& cPeers != gch
				&& cPeers->level > gch->level - PEER_BALANCE_DISTANCE
				&& cPeers->level < gch->level + PEER_BALANCE_DISTANCE)
			{
				peer_factor = std::max((double)1, peer_factor - 0.25);
			}
		}
	}

	if (group_amount == 2)
		peer_factor = std::max((double)1, peer_factor * 0.66);

	if (group_amount == 3)
		peer_factor = 1;

	xp *= peer_factor;
	/*
	sprintf(buf,"(WIZ_LOGGING) %s gains experience in a group of %d: peer modifier is %f%%.", gch->name,group_amount,peer_factor*100);
	wiznet(buf,nullptr,nullptr,WIZ_LOG,0,0);
	*/

	return (int)xp;
}